

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioCOMConstructEXT(FAudio **ppFAudio,uint8_t version)

{
  uint32_t uVar1;
  undefined1 in_SIL;
  undefined8 in_RDI;
  FAudio **unaff_retaddr;
  FAudioFreeFunc in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  
  uVar1 = FAudioCOMConstructWithCustomAllocatorEXT
                    (unaff_retaddr,(uint8_t)((ulong)in_RDI >> 0x38),
                     (FAudioMallocFunc)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
                     in_stack_ffffffffffffffe8,(FAudioReallocFunc)0x124324);
  return uVar1;
}

Assistant:

uint32_t FAudioCOMConstructEXT(FAudio **ppFAudio, uint8_t version)
{
	return FAudioCOMConstructWithCustomAllocatorEXT(
		ppFAudio,
		version,
		FAudio_malloc,
		FAudio_free,
		FAudio_realloc
	);
}